

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

bool __thiscall Lowerer::IsNullOrUndefRegOpnd(Lowerer *this,RegOpnd *opnd)

{
  bool bVar1;
  bool local_2d;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_2c;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_2a;
  StackSym *local_28;
  StackSym *sym;
  RegOpnd *opnd_local;
  Lowerer *this_local;
  
  local_28 = opnd->m_sym;
  sym = (StackSym *)opnd;
  opnd_local = (RegOpnd *)this;
  bVar1 = StackSym::IsIntConst(local_28);
  if ((!bVar1) && (bVar1 = StackSym::IsFloatConst(local_28), !bVar1)) {
    local_2a.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         IR::Opnd::GetValueType((Opnd *)sym);
    bVar1 = ValueType::IsUndefined((ValueType *)&local_2a.field_0);
    local_2d = true;
    if (!bVar1) {
      local_2c.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           IR::Opnd::GetValueType((Opnd *)sym);
      local_2d = ValueType::IsNull((ValueType *)&local_2c.field_0);
    }
    return local_2d;
  }
  return false;
}

Assistant:

bool Lowerer::IsNullOrUndefRegOpnd(IR::RegOpnd *opnd) const
{
    StackSym *sym = opnd->m_sym;

    if (sym->IsIntConst() || sym->IsFloatConst())
    {
        return false;
    }

    return opnd->GetValueType().IsUndefined() || opnd->GetValueType().IsNull();
}